

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O0

void whisper_kv_cache_seq_cp
               (whisper_kv_cache *cache,whisper_seq_id seq_id_src,whisper_seq_id seq_id_dst,
               whisper_pos p0,whisper_pos p1)

{
  bool bVar1;
  reference pvVar2;
  int in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  int in_R8D;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar3;
  uint32_t i;
  undefined1 in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffd9;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar4;
  
  if (in_ECX < 0) {
    in_ECX = 0;
  }
  if (in_R8D < 0) {
    in_R8D = std::numeric_limits<int>::max();
  }
  *in_RDI = 0;
  for (uVar4 = 0; uVar4 < (uint)in_RDI[1]; uVar4 = uVar4 + 1) {
    std::vector<whisper_kv_cell,_std::allocator<whisper_kv_cell>_>::operator[]
              ((vector<whisper_kv_cell,_std::allocator<whisper_kv_cell>_> *)(in_RDI + 4),
               (ulong)uVar4);
    bVar1 = whisper_kv_cell::has_seq_id
                      ((whisper_kv_cell *)CONCAT44(uVar4,in_stack_ffffffffffffffe0),
                       (whisper_seq_id *)
                       CONCAT71(in_stack_ffffffffffffffd9,in_stack_ffffffffffffffd8));
    if (((bVar1) &&
        (pvVar2 = std::vector<whisper_kv_cell,_std::allocator<whisper_kv_cell>_>::operator[]
                            ((vector<whisper_kv_cell,_std::allocator<whisper_kv_cell>_> *)
                             (in_RDI + 4),(ulong)uVar4), in_ECX <= pvVar2->pos)) &&
       (pvVar2 = std::vector<whisper_kv_cell,_std::allocator<whisper_kv_cell>_>::operator[]
                           ((vector<whisper_kv_cell,_std::allocator<whisper_kv_cell>_> *)
                            (in_RDI + 4),(ulong)uVar4), pvVar2->pos < in_R8D)) {
      std::vector<whisper_kv_cell,_std::allocator<whisper_kv_cell>_>::operator[]
                ((vector<whisper_kv_cell,_std::allocator<whisper_kv_cell>_> *)(in_RDI + 4),
                 (ulong)uVar4);
      pVar3 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)CONCAT44(in_ESI,in_EDX),
                         (value_type_conflict3 *)CONCAT44(in_ECX,in_R8D));
      in_stack_ffffffffffffffd8 = pVar3.second;
    }
  }
  return;
}

Assistant:

static void whisper_kv_cache_seq_cp(
        struct whisper_kv_cache & cache,
                 whisper_seq_id   seq_id_src,
                 whisper_seq_id   seq_id_dst,
                    whisper_pos   p0,
                    whisper_pos   p1) {
    if (p0 < 0) p0 = 0;
    if (p1 < 0) p1 = std::numeric_limits<whisper_pos>::max();

    cache.head = 0;

    for (uint32_t i = 0; i < cache.size; ++i) {
        if (cache.cells[i].has_seq_id(seq_id_src) && cache.cells[i].pos >= p0 && cache.cells[i].pos < p1) {
            cache.cells[i].seq_id.insert(seq_id_dst);
        }
    }
}